

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

void __thiscall
cmFileMonitor::MonitorPaths
          (cmFileMonitor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,Callback *cb)

{
  string *psVar1;
  cmRootWatcher *p;
  bool bVar2;
  ulong uVar3;
  cmFileWatcher *this_00;
  long lVar4;
  cmRealDirectoryWatcher *pcVar5;
  cmFileWatcher *pcVar6;
  cmRootWatcher *this_01;
  string *p_00;
  string *ps;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathSegments;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  local_50;
  
  p_00 = (paths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (p_00 == psVar1) {
      (*(this->Root->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher[5])
                ();
      return;
    }
    pathSegments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pathSegments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pathSegments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmsys::SystemTools::SplitPath(p_00,&pathSegments,true);
    bVar2 = cmsys::SystemTools::FileIsDirectory(p_00);
    uVar3 = (long)pathSegments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)pathSegments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (1 < uVar3) {
      this_01 = this->Root;
      lVar7 = 0;
      for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
        if (this_01 == (cmRootWatcher *)0x0) {
          __assert_fail("currentWatcher",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                        ,0x140,
                        "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                       );
        }
        bVar9 = uVar3 - 1 == uVar8;
        if ((uVar8 == 0) && (bVar9 && !bVar2)) {
          __assert_fail("!(fileSegment && rootSegment)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                        ,0x146,
                        "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                       );
        }
        if (*(long *)((long)&(pathSegments.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar7)
            != 0) {
          ps = (string *)
               ((long)&((pathSegments.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7);
          this_00 = (cmFileWatcher *)
                    cmVirtualDirectoryWatcher::Find(&this_01->super_cmVirtualDirectoryWatcher,ps);
          if (this_00 == (cmFileWatcher *)0x0) {
            if (uVar8 == 0) {
              p = this->Root;
              if (this_01 != p) {
                __assert_fail("currentWatcher == this->Root",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                              ,0x150,
                              "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                             );
              }
              this_00 = (cmFileWatcher *)operator_new(0x70);
              cmRootDirectoryWatcher::cmRootDirectoryWatcher((cmRootDirectoryWatcher *)this_00,p,ps)
              ;
              pcVar6 = (cmFileWatcher *)
                       cmVirtualDirectoryWatcher::Find(&this_01->super_cmVirtualDirectoryWatcher,ps)
              ;
              if (pcVar6 != this_00) {
                __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                              ,0x152,
                              "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                             );
              }
            }
            else if (bVar9 && !bVar2) {
              if (this_01 == this->Root) {
                __assert_fail("currentWatcher != this->Root",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                              ,0x154,
                              "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                             );
              }
              this_00 = (cmFileWatcher *)operator_new(0x48);
              pcVar5 = (cmRealDirectoryWatcher *)
                       __dynamic_cast(this_01,&cmVirtualDirectoryWatcher::typeinfo,
                                      &cmRealDirectoryWatcher::typeinfo,0);
              std::
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
              ::function(&local_50,cb);
              cmFileWatcher::cmFileWatcher(this_00,pcVar5,ps,&local_50);
              std::_Function_base::~_Function_base(&local_50.super__Function_base);
              pcVar6 = (cmFileWatcher *)
                       cmVirtualDirectoryWatcher::Find(&this_01->super_cmVirtualDirectoryWatcher,ps)
              ;
              if (pcVar6 != this_00) {
                __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                              ,0x158,
                              "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                             );
              }
            }
            else {
              this_00 = (cmFileWatcher *)operator_new(0x70);
              pcVar5 = (cmRealDirectoryWatcher *)
                       __dynamic_cast(this_01,&cmVirtualDirectoryWatcher::typeinfo,
                                      &cmRealDirectoryWatcher::typeinfo,0);
              cmDirectoryWatcher::cmDirectoryWatcher((cmDirectoryWatcher *)this_00,pcVar5,ps);
              pcVar6 = (cmFileWatcher *)
                       cmVirtualDirectoryWatcher::Find(&this_01->super_cmVirtualDirectoryWatcher,ps)
              ;
              if (pcVar6 != this_00) {
                __assert_fail("currentWatcher->Find(currentSegment) == nextWatcher",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                              ,0x15d,
                              "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                             );
              }
            }
          }
          else if (bVar9 && !bVar2) {
            lVar4 = __dynamic_cast(this_00,&cmIBaseWatcher::typeinfo,&cmFileWatcher::typeinfo,0);
            if (lVar4 == 0) {
              __assert_fail("filePtr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                            ,0x162,
                            "void cmFileMonitor::MonitorPaths(const std::vector<std::string> &, const Callback &)"
                           );
            }
            std::
            vector<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>_>
            ::push_back((vector<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>_>
                         *)(lVar4 + 0x30),cb);
            goto LAB_001431ff;
          }
          this_01 = (cmRootWatcher *)
                    __dynamic_cast(this_00,&cmIBaseWatcher::typeinfo,
                                   &cmVirtualDirectoryWatcher::typeinfo,0);
        }
LAB_001431ff:
        lVar7 = lVar7 + 0x20;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pathSegments);
    p_00 = p_00 + 1;
  } while( true );
}

Assistant:

void cmFileMonitor::MonitorPaths(const std::vector<std::string>& paths,
                                 Callback const& cb)
{
  for (std::string const& p : paths) {
    std::vector<std::string> pathSegments;
    cmsys::SystemTools::SplitPath(p, pathSegments, true);
    const bool pathIsFile = !cmsys::SystemTools::FileIsDirectory(p);

    const size_t segmentCount = pathSegments.size();
    if (segmentCount < 2) { // Expect at least rootdir and filename
      continue;
    }
    cmVirtualDirectoryWatcher* currentWatcher = this->Root;
    for (size_t i = 0; i < segmentCount; ++i) {
      assert(currentWatcher);

      const bool fileSegment = (i == segmentCount - 1 && pathIsFile);
      const bool rootSegment = (i == 0);
      assert(
        !(fileSegment &&
          rootSegment)); // Can not be both filename and root part of the path!

      const std::string& currentSegment = pathSegments[i];
      if (currentSegment.empty()) {
        continue;
      }

      cmIBaseWatcher* nextWatcher = currentWatcher->Find(currentSegment);
      if (!nextWatcher) {
        if (rootSegment) { // Root part
          assert(currentWatcher == this->Root);
          nextWatcher = new cmRootDirectoryWatcher(this->Root, currentSegment);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        } else if (fileSegment) { // File part
          assert(currentWatcher != this->Root);
          nextWatcher = new cmFileWatcher(
            dynamic_cast<cmRealDirectoryWatcher*>(currentWatcher),
            currentSegment, cb);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        } else { // Any normal directory in between
          nextWatcher = new cmDirectoryWatcher(
            dynamic_cast<cmRealDirectoryWatcher*>(currentWatcher),
            currentSegment);
          assert(currentWatcher->Find(currentSegment) == nextWatcher);
        }
      } else {
        if (fileSegment) {
          auto filePtr = dynamic_cast<cmFileWatcher*>(nextWatcher);
          assert(filePtr);
          filePtr->AppendCallback(cb);
          continue;
        }
      }
      currentWatcher = dynamic_cast<cmVirtualDirectoryWatcher*>(nextWatcher);
    }
  }
  this->Root->StartWatching();
}